

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O2

void sznet::net::sockets::sz_fromipport(char *ip,uint16_t port,sockaddr_in *addr)

{
  in_port_t iVar1;
  int iVar2;
  SourceFile file;
  Logger local_ff0;
  undefined1 local_20 [12];
  
  addr->sin_family = 2;
  iVar1 = swap_bytes(port);
  addr->sin_port = iVar1;
  iVar2 = inet_pton(2,ip,&addr->sin_addr);
  if (iVar2 < 1) {
    Logger::SourceFile::SourceFile<101>
              ((SourceFile *)local_20,
               (char (*) [101])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_20._0_8_;
    file.m_size = local_20._8_4_;
    Logger::Logger(&local_ff0,file,0xc9,false);
    LogStream::operator<<(&local_ff0.m_impl.m_stream,"sockets::sz_fromipport");
    Logger::~Logger(&local_ff0);
  }
  return;
}

Assistant:

void sz_fromipport(const char* ip, uint16_t port, struct sockaddr_in* addr)
{
	addr->sin_family = AF_INET;
	addr->sin_port = hostToNetwork16(port);
	if (::inet_pton(AF_INET, ip, &addr->sin_addr) <= 0)
	{
		LOG_SYSERR << "sockets::sz_fromipport";
	}
}